

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resample.c
# Opt level: O0

void WebRtcSpl_Resample8khzTo22khz
               (int16_t *in,int16_t *out,WebRtcSpl_State8khzTo22khz *state,int32_t *tmpmem)

{
  int local_2c;
  int k;
  int32_t *tmpmem_local;
  WebRtcSpl_State8khzTo22khz *state_local;
  int16_t *out_local;
  int16_t *in_local;
  
  state_local = (WebRtcSpl_State8khzTo22khz *)out;
  out_local = in;
  for (local_2c = 0; local_2c < 2; local_2c = local_2c + 1) {
    WebRtcSpl_UpBy2ShortToInt(out_local,0x28,tmpmem + 0x12,state->S_8_16);
    tmpmem[10] = state->S_16_11[0];
    tmpmem[0xb] = state->S_16_11[1];
    tmpmem[0xc] = state->S_16_11[2];
    tmpmem[0xd] = state->S_16_11[3];
    tmpmem[0xe] = state->S_16_11[4];
    tmpmem[0xf] = state->S_16_11[5];
    tmpmem[0x10] = state->S_16_11[6];
    tmpmem[0x11] = state->S_16_11[7];
    state->S_16_11[0] = tmpmem[0x5a];
    state->S_16_11[1] = tmpmem[0x5b];
    state->S_16_11[2] = tmpmem[0x5c];
    state->S_16_11[3] = tmpmem[0x5d];
    state->S_16_11[4] = tmpmem[0x5e];
    state->S_16_11[5] = tmpmem[0x5f];
    state->S_16_11[6] = tmpmem[0x60];
    state->S_16_11[7] = tmpmem[0x61];
    WebRtcSpl_32khzTo22khzIntToInt(tmpmem + 10,tmpmem,5);
    WebRtcSpl_UpBy2IntToShort(tmpmem,0x37,(int16_t *)state_local,state->S_11_22);
    out_local = out_local + 0x28;
    state_local = (WebRtcSpl_State8khzTo22khz *)(state_local[2].S_8_16 + 7);
  }
  return;
}

Assistant:

void WebRtcSpl_Resample8khzTo22khz(const int16_t* in, int16_t* out,
                                   WebRtcSpl_State8khzTo22khz* state, int32_t* tmpmem)
{
    int k;

    // process two blocks of 10/SUB_BLOCKS_8_22 ms (to reduce temp buffer size)
    for (k = 0; k < SUB_BLOCKS_8_22; k++)
    {
        ///// 8 --> 16 /////
        // int16_t  in[80/SUB_BLOCKS_8_22]
        // int32_t out[160/SUB_BLOCKS_8_22]
        /////
        WebRtcSpl_UpBy2ShortToInt(in, 80 / SUB_BLOCKS_8_22, tmpmem + 18, state->S_8_16);

        ///// 16 --> 11 /////
        // int32_t  in[160/SUB_BLOCKS_8_22]
        // int32_t out[110/SUB_BLOCKS_8_22]
        /////
        // copy state to and from input array
        tmpmem[10] = state->S_16_11[0];
        tmpmem[11] = state->S_16_11[1];
        tmpmem[12] = state->S_16_11[2];
        tmpmem[13] = state->S_16_11[3];
        tmpmem[14] = state->S_16_11[4];
        tmpmem[15] = state->S_16_11[5];
        tmpmem[16] = state->S_16_11[6];
        tmpmem[17] = state->S_16_11[7];
        state->S_16_11[0] = tmpmem[160 / SUB_BLOCKS_8_22 + 10];
        state->S_16_11[1] = tmpmem[160 / SUB_BLOCKS_8_22 + 11];
        state->S_16_11[2] = tmpmem[160 / SUB_BLOCKS_8_22 + 12];
        state->S_16_11[3] = tmpmem[160 / SUB_BLOCKS_8_22 + 13];
        state->S_16_11[4] = tmpmem[160 / SUB_BLOCKS_8_22 + 14];
        state->S_16_11[5] = tmpmem[160 / SUB_BLOCKS_8_22 + 15];
        state->S_16_11[6] = tmpmem[160 / SUB_BLOCKS_8_22 + 16];
        state->S_16_11[7] = tmpmem[160 / SUB_BLOCKS_8_22 + 17];

        WebRtcSpl_32khzTo22khzIntToInt(tmpmem + 10, tmpmem, 10 / SUB_BLOCKS_8_22);

        ///// 11 --> 22 /////
        // int32_t  in[110/SUB_BLOCKS_8_22]
        // int16_t out[220/SUB_BLOCKS_8_22]
        /////
        WebRtcSpl_UpBy2IntToShort(tmpmem, 110 / SUB_BLOCKS_8_22, out, state->S_11_22);

        // move input/output pointers 10/SUB_BLOCKS_8_22 ms seconds ahead
        in += 80 / SUB_BLOCKS_8_22;
        out += 220 / SUB_BLOCKS_8_22;
    }
}